

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivision_geometry_device.cpp
# Opt level: O2

Vec3fa __thiscall
embree::renderPixelStandard(embree *this,float x,float y,ISPCCamera *camera,RayStats *stats)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  float fVar8;
  ulong extraout_XMM1_Qa;
  ulong uVar6;
  float fVar9;
  float fVar10;
  undefined1 auVar7 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  Vec3fa VVar17;
  Vec3fa dPdv;
  Vec3fa dPdu;
  undefined1 local_108 [8];
  float fStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  float local_d8;
  float local_d4;
  float fStack_d0;
  undefined8 uStack_cc;
  undefined4 local_c4;
  int iStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined8 local_88;
  float fStack_80;
  undefined8 uStack_7c;
  ulong uStack_74;
  undefined4 uStack_6c;
  ulong local_68;
  float *local_60;
  float *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined4 local_38;
  
  local_f8 = (camera->xfm).l.vy.field_0.field_0.x * y + (camera->xfm).l.vx.field_0.field_0.x * x +
             (camera->xfm).l.vz.field_0.field_0.x;
  auVar16._0_8_ = *(undefined8 *)((long)&(camera->xfm).l.vx.field_0 + 4);
  uVar1 = *(undefined8 *)((long)&(camera->xfm).l.vy.field_0 + 4);
  uVar2 = *(undefined8 *)((long)&(camera->xfm).l.vz.field_0 + 4);
  fStack_f4 = y * (float)uVar1 + (float)auVar16._0_8_ * x + (float)uVar2;
  fVar8 = y * (float)((ulong)uVar1 >> 0x20) + (float)((ulong)auVar16._0_8_ >> 0x20) * x +
          (float)((ulong)uVar2 >> 0x20);
  fVar4 = local_f8 * local_f8 + fStack_f4 * fStack_f4 + fVar8 * fVar8;
  auVar16 = rsqrtss(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
  fVar15 = auVar16._0_4_;
  fStack_f0 = fVar15 * fVar15 * fVar4 * -0.5 * fVar15 + fVar15 * 1.5;
  local_f8 = local_f8 * fStack_f0;
  fStack_f4 = fStack_f0 * fStack_f4;
  fStack_f0 = fStack_f0 * fVar8;
  fStack_100 = (float)(int)((ulong)*(undefined8 *)((long)&(camera->xfm).p.field_0 + 4) >> 0x20);
  local_108 = *(undefined8 *)&(camera->xfm).p.field_0;
  unique0x10000030 = 0;
  uStack_ec = 0;
  local_e8 = 0xffffffff7f800000;
  local_c4 = 0xffffffff;
  iStack_c0 = -1;
  uStack_bc = 0xffffffff;
  uStack_b8 = 0xffffffff;
  rtcIntersect1(g_scene,local_108,0);
  stats->numRays = stats->numRays + 1;
  auVar16._0_8_ = 0;
  *(undefined1 (*) [16])this = (undefined1  [16])0x0;
  uVar6 = extraout_XMM1_Qa;
  if (iStack_c0 != -1) {
    if (iStack_c0 == 0) {
      fVar4 = 0.8;
      fVar8 = 0.0;
      fVar15 = 0.0;
      fVar13 = 0.0;
    }
    else {
      fVar4 = 0.9;
      fVar8 = 0.6;
      fVar15 = 0.5;
      local_88 = rtcGetGeometry(g_scene);
      fStack_80 = (float)local_c4;
      uStack_7c = uStack_cc;
      uStack_74 = 1;
      local_68 = 0;
      local_60 = &local_98;
      local_58 = &local_a8;
      local_50 = 0;
      uStack_48 = 0;
      local_40 = 0;
      local_38 = 3;
      rtcInterpolate();
      fVar13 = fStack_9c * fStack_8c - fStack_8c * fStack_9c;
      fStack_d0 = fStack_a4 * local_98 - fStack_94 * local_a8;
      local_d8 = fStack_a0 * fStack_94 - fStack_90 * fStack_a4;
      local_d4 = local_a8 * fStack_90 - local_98 * fStack_a0;
    }
    auVar5._0_4_ = fVar4 * 0.5;
    auVar5._4_4_ = fVar8 * 0.5;
    auVar5._8_4_ = fVar15 * 0.5;
    auVar5._12_4_ = 0;
    auVar16 = rsqrtss(auVar5,0x40400000);
    fVar14 = auVar16._0_4_;
    fVar14 = fVar14 * 1.5 - fVar14 * fVar14 * fVar14 * 1.5;
    *(float *)this = auVar5._0_4_ + 0.0;
    *(float *)(this + 4) = auVar5._4_4_ + 0.0;
    *(float *)(this + 8) = auVar5._8_4_ + 0.0;
    *(undefined4 *)(this + 0xc) = 0;
    fStack_80 = (float)local_e8 * fStack_f0 + fStack_100;
    local_88 = CONCAT44((float)local_e8 * fStack_f4 + (float)local_108._4_4_,
                        (float)local_e8 * local_f8 + (float)local_108._0_4_);
    uStack_7c = CONCAT44(-(fVar14 * -1.0),0x3a83126f);
    uStack_74 = CONCAT44(fVar14 * -1.0,fVar14 * -1.0) ^ 0x8000000080000000;
    uStack_6c = 0;
    local_68 = 0xffffffff7f800000;
    uStack_48 = CONCAT44(0xffffffff,(undefined4)uStack_48);
    local_40 = 0xffffffffffffffff;
    local_38 = 0xffffffff;
    rtcOccluded1(g_scene,&local_88,0);
    stats->numRays = stats->numRays + 1;
    uVar6 = local_68 & 0xffffffff;
    auVar16._0_8_ = 0;
    if (0.0 <= (float)local_68) {
      fVar9 = local_d4 * local_d4;
      fVar10 = fStack_d0 * fStack_d0;
      fVar13 = fVar13 * fVar13;
      fVar11 = fVar9 + local_d8 * local_d8 + fVar10;
      fVar12 = fVar9 + fVar9 + fVar13;
      fVar10 = fVar9 + fVar10 + fVar10;
      fVar13 = fVar9 + fVar13 + fVar13;
      auVar7._4_4_ = fVar12;
      auVar7._0_4_ = fVar11;
      auVar7._8_4_ = fVar10;
      auVar7._12_4_ = fVar13;
      auVar3._4_4_ = fVar12;
      auVar3._0_4_ = fVar11;
      auVar3._8_4_ = fVar10;
      auVar3._12_4_ = fVar13;
      auVar16 = rsqrtss(auVar7,auVar3);
      fVar13 = auVar16._0_4_;
      fVar13 = fVar13 * fVar13 * fVar11 * -0.5 * fVar13 + fVar13 * 1.5;
      fVar13 = -(fVar14 * -1.0 * fVar13 * fStack_d0 +
                fVar14 * -1.0 * fVar13 * local_d4 + fVar14 * -1.0 * fVar13 * local_d8);
      if (1.0 <= fVar13) {
        fVar13 = 1.0;
      }
      fVar14 = 0.0;
      if (0.0 <= fVar13) {
        fVar14 = fVar13;
      }
      uVar6 = CONCAT44(fVar8 * fVar14,fVar4 * fVar14);
      auVar16._0_8_ =
           CONCAT44(auVar5._4_4_ + 0.0 + fVar8 * fVar14,auVar5._0_4_ + 0.0 + fVar4 * fVar14);
      auVar16._8_4_ = auVar5._8_4_ + 0.0 + fVar15 * fVar14;
      auVar16._12_4_ = fVar14 * 0.0 + 0.0;
      *(undefined1 (*) [16])this = auVar16;
    }
  }
  VVar17.field_0._8_8_ = uVar6;
  VVar17.field_0._0_8_ = auVar16._0_8_;
  return (Vec3fa)VVar17.field_0;
}

Assistant:

Vec3fa renderPixelStandard(float x, float y, const ISPCCamera& camera, RayStats& stats)
{
  /* initialize ray */
  Ray ray(Vec3fa(camera.xfm.p), Vec3fa(normalize(x*camera.xfm.l.vx + y*camera.xfm.l.vy + camera.xfm.l.vz)), 0.0f, inf);

  /* intersect ray with scene */
  rtcIntersect1(g_scene,RTCRayHit_(ray));
  RayStats_addRay(stats);

  /* shade pixels */
  Vec3fa color = Vec3fa(0.0f);
  if (ray.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    Vec3fa diffuse = ray.geomID != 0 ? Vec3fa(0.9f,0.6f,0.5f) : Vec3fa(0.8f,0.0f,0.0f);

    Vec3fa Ng = ray.Ng;
    if (ray.geomID > 0) {
      Vec3fa dPdu,dPdv;
      auto geomID = ray.geomID; {
        rtcInterpolate1(rtcGetGeometry(g_scene,geomID),ray.primID,ray.u,ray.v,RTC_BUFFER_TYPE_VERTEX,0,nullptr,&dPdu.x,&dPdv.x,3);
      }
      Ng = cross(dPdu,dPdv);
    }

    color = color + diffuse*0.5f;
    Vec3fa lightDir = normalize(Vec3fa(-1,-1,-1));

    /* initialize shadow ray */
    Ray shadow(ray.org + ray.tfar*ray.dir, neg(lightDir), 0.001f, inf);

    /* trace shadow ray */
    rtcOccluded1(g_scene,RTCRay_(shadow));
    RayStats_addShadowRay(stats);

    /* add light contribution */
    if (shadow.tfar >= 0.0f)
      color = color + diffuse*clamp(-dot(lightDir,normalize(Ng)),0.0f,1.0f);
  }
  return color;
}